

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
                float zero_deadzone_halfsize)

{
  ulong uVar1;
  long lVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  fVar5 = 0.0;
  lVar2 = v_max - v_min;
  if (lVar2 != 0) {
    uVar4 = v_max;
    if (v_max >= v_min && lVar2 != 0) {
      uVar4 = v_min;
    }
    uVar1 = v_max;
    if (v_max < v_min) {
      uVar1 = v_min;
    }
    if (v < uVar1) {
      uVar1 = v;
    }
    if (v < uVar4) {
      uVar1 = uVar4;
    }
    if (is_logarithmic) {
      uVar4 = v_min;
      if (v_max < v_min) {
        uVar4 = v_max;
      }
      uVar3 = v_min;
      if (v_min < v_max) {
        uVar3 = v_max;
      }
      auVar6._8_4_ = (int)(uVar4 >> 0x20);
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      dVar10 = (auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      dVar11 = (double)logarithmic_zero_epsilon;
      dVar12 = dVar11;
      if (dVar11 <= dVar10) {
        dVar12 = dVar10;
      }
      auVar7._8_4_ = (int)(uVar1 >> 0x20);
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      dVar10 = (auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      fVar5 = 0.0;
      if (dVar12 < dVar10) {
        auVar8._8_4_ = (int)(uVar3 >> 0x20);
        auVar8._0_8_ = uVar3;
        auVar8._12_4_ = 0x45300000;
        dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        if (dVar11 <= dVar9) {
          dVar11 = dVar9;
        }
        if (dVar11 <= dVar10) {
          fVar5 = 1.0;
        }
        else {
          dVar10 = log(dVar10 / dVar12);
          dVar11 = log(dVar11 / dVar12);
          fVar5 = (float)(dVar10 / dVar11);
        }
      }
      if (v_max < v_min) {
        fVar5 = 1.0 - fVar5;
      }
    }
    else {
      fVar5 = (float)((double)(long)(uVar1 - v_min) / (double)lVar2);
    }
  }
  return fVar5;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;
        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }
    else
    {
        // Linear slider
        return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
    }
}